

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool __thiscall
el::Configurations::hasConfiguration(Configurations *this,ConfigurationType configurationType)

{
  char cVar1;
  bool result;
  EnumType lIndex;
  undefined1 local_51;
  uint local_50;
  ConfigurationType local_4c;
  undefined8 *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  
  local_50 = 2;
  local_51 = 0;
  local_40 = 0;
  local_4c = configurationType;
  local_48 = (undefined8 *)operator_new(0x20);
  *local_48 = this;
  local_48[1] = &local_50;
  local_48[2] = &local_4c;
  local_48[3] = &local_51;
  local_30 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/easyloggingpp/src/easylogging++.cc:242:38)>
             ::_M_invoke;
  local_38 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/easyloggingpp/src/easylogging++.cc:242:38)>
             ::_M_manager;
  do {
    cVar1 = (*local_30)(&local_48);
    if ((cVar1 != '\0') || (local_50 = local_50 * 2, 0x80 < local_50)) goto LAB_00135429;
  } while (local_38 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_00135429:
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return (bool)local_51;
}

Assistant:

bool Configurations::hasConfiguration(ConfigurationType configurationType) {
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  bool result = false;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    if (hasConfiguration(LevelHelper::castFromInt(lIndex), configurationType)) {
      result = true;
    }
    return result;
  });
  return result;
}